

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

int __thiscall deqp::gles31::bb::BufferLayout::getVariableIndex(BufferLayout *this,string *name)

{
  pointer pBVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  ulong uVar3;
  size_type *psVar4;
  uint uVar5;
  
  pBVar1 = (this->bufferVars).
           super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((long)(this->bufferVars).
                      super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) * 0x38e38e39;
  if (0 < (int)uVar5) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    psVar4 = &(pBVar1->name)._M_string_length;
    uVar3 = 0;
    do {
      if ((*psVar4 == __n) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((string *)(psVar4 + -1))->_M_dataplus)._M_p,__s2,__n), iVar2 == 0)))) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 9;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  return -1;
}

Assistant:

int BufferLayout::getVariableIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)bufferVars.size(); ndx++)
	{
		if (bufferVars[ndx].name == name)
			return ndx;
	}
	return -1;
}